

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O1

utf8proc_ssize_t
duckdb::seqindex_write_char_decomposed
          (utf8proc_uint16_t seqindex,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  ushort *puVar1;
  ushort uVar2;
  bool bVar3;
  utf8proc_ssize_t uVar4;
  ushort *puVar5;
  utf8proc_int32_t *dst_00;
  uint uVar6;
  undefined6 in_register_0000003a;
  int iVar7;
  int iVar8;
  long lVar9;
  
  lVar9 = (ulong)((uint)CONCAT62(in_register_0000003a,seqindex) & 0x3fff) * 2;
  puVar5 = (ushort *)(utf8proc_sequences + lVar9);
  uVar6 = (uint)(CONCAT62(in_register_0000003a,seqindex) >> 0xe) & 0x3ffff;
  if (uVar6 == 3) {
    uVar6 = (uint)*puVar5;
    puVar5 = (ushort *)(utf8proc_sequences + lVar9 + 2);
  }
  lVar9 = 0;
  iVar7 = uVar6 + 1;
  while( true ) {
    uVar2 = *puVar5;
    uVar6 = (uint)uVar2;
    if ((uVar6 & 0xf800) == 0xd800) {
      puVar1 = puVar5 + 1;
      puVar5 = puVar5 + 1;
      uVar6 = (uVar2 & 0x3ff) * 0x400 + (*puVar1 & 0x3ff) + 0x10000;
    }
    dst_00 = dst + lVar9;
    if (dst == (utf8proc_int32_t *)0x0) {
      dst_00 = (utf8proc_int32_t *)0x0;
    }
    uVar4 = bufsize - lVar9;
    if (uVar4 == 0 || bufsize < lVar9) {
      uVar4 = 0;
    }
    uVar4 = utf8proc_decompose_char(uVar6,dst_00,uVar4,options,last_boundclass);
    lVar9 = lVar9 + uVar4;
    if (lVar9 < 0) break;
    puVar5 = puVar5 + 1;
    iVar8 = iVar7 + -1;
    bVar3 = iVar7 < 1;
    iVar7 = iVar8;
    if (iVar8 == 0 || bVar3) {
      return lVar9;
    }
  }
  return -2;
}

Assistant:

static utf8proc_ssize_t seqindex_write_char_decomposed(utf8proc_uint16_t seqindex, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  utf8proc_ssize_t written = 0;
  const utf8proc_uint16_t *entry = &utf8proc_sequences[seqindex & 0x3FFF];
  int len = seqindex >> 14;
  if (len >= 3) {
    len = *entry;
    entry++;
  }
  for (; len >= 0; entry++, len--) {
    utf8proc_int32_t entry_cp = seqindex_decode_entry(&entry);

    written += utf8proc_decompose_char(entry_cp, dst ? dst+written : nullptr,
      (bufsize > written) ? (bufsize - written) : 0, options,
    last_boundclass);
    if (written < 0) return UTF8PROC_ERROR_OVERFLOW;
  }
  return written;
}